

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O2

type rest_rpc::rpc_service::router::
     call_helper<void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&),0ul,std::__cxx11::string>
               (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                **f,index_sequence<0UL> *param_2,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *tup,weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  _func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  weak_ptr<rest_rpc::rpc_service::connection> wVar2;
  
  p_Var1 = *f;
  std::__weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd8,
             &ptr->super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>);
  wVar2.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tup;
  wVar2.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffd8;
  (*p_Var1)(wVar2,extraout_RDX);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }